

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_p.h
# Opt level: O2

socklen_t anon_unknown.dwarf_94bbba::setSockaddr(sockaddr_in *sin,QHostAddress *addr,quint16 port)

{
  quint32 qVar1;
  uint uVar2;
  
  sin->sin_zero[4] = '\0';
  sin->sin_zero[5] = '\0';
  sin->sin_zero[6] = '\0';
  sin->sin_zero[7] = '\0';
  sin->sin_addr = 0;
  sin->sin_zero[0] = '\0';
  sin->sin_zero[1] = '\0';
  sin->sin_zero[2] = '\0';
  sin->sin_zero[3] = '\0';
  sin->sin_family = 2;
  sin->sin_port = port << 8 | port >> 8;
  qVar1 = QHostAddress::toIPv4Address(addr,(bool *)0x0);
  uVar2 = qVar1 >> 0x18 | (qVar1 & 0xff0000) >> 8 | (qVar1 & 0xff00) << 8 | qVar1 << 0x18;
  (sin->sin_addr).s_addr = uVar2;
  return uVar2;
}

Assistant:

inline QT_SOCKLEN_T setSockaddr(sockaddr_in *sin, const QHostAddress &addr, quint16 port = 0)
{
    *sin = {};
    SetSALen::set(sin, sizeof(*sin));
    sin->sin_family = AF_INET;
    sin->sin_port = htons(port);
    sin->sin_addr.s_addr = htonl(addr.toIPv4Address());
    return sizeof(*sin);
}